

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathDebugDumpObject(FILE *output,xmlXPathObjectPtr cur,int depth)

{
  ulong uVar1;
  double dVar2;
  xmlNodeSetPtr pxVar3;
  int *piVar4;
  _xmlNode *p_Var5;
  int iVar6;
  size_t sVar7;
  xmlNodePtr cur_00;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  _xmlNode *node;
  char shift [100];
  char local_178 [112];
  char local_108 [112];
  char local_98 [104];
  
  if (output == (FILE *)0x0) {
    return;
  }
  if (depth < 1) {
    uVar9 = 0;
  }
  else {
    uVar10 = 0x18;
    if (depth - 1U < 0x18) {
      uVar10 = depth - 1U;
    }
    uVar9 = (ulong)(uVar10 * 2 + 2);
    memset(local_108,0x20,uVar9);
  }
  (local_108 + uVar9)[0] = '\0';
  (local_108 + uVar9)[1] = '\0';
  fputs(local_108,(FILE *)output);
  if (cur == (xmlXPathObjectPtr)0x0) {
    pcVar8 = "Object is empty (NULL)\n";
    goto LAB_001db423;
  }
  switch(cur->type) {
  case XPATH_UNDEFINED:
    pcVar8 = "Object is uninitialized\n";
    sVar7 = 0x18;
    goto LAB_001db428;
  case XPATH_NODESET:
    fwrite("Object is a Node Set :\n",0x17,1,(FILE *)output);
    pxVar3 = cur->nodesetval;
    if (depth < 1) {
      uVar9 = 0;
    }
    else {
      uVar10 = 0x18;
      if (depth - 1U < 0x18) {
        uVar10 = depth - 1U;
      }
      uVar9 = (ulong)(uVar10 * 2 + 2);
      memset(local_178,0x20,uVar9);
    }
    (local_178 + uVar9)[0] = '\0';
    (local_178 + uVar9)[1] = '\0';
    if (pxVar3 != (xmlNodeSetPtr)0x0) {
      fprintf((FILE *)output,"Set contains %d nodes:\n",(ulong)(uint)pxVar3->nodeNr);
      if (pxVar3->nodeNr < 1) {
        return;
      }
      uVar9 = 0;
      do {
        fputs(local_178,(FILE *)output);
        uVar1 = uVar9 + 1;
        fprintf((FILE *)output,"%d",uVar1 & 0xffffffff);
        xmlXPathDebugDumpNode(output,pxVar3->nodeTab[uVar9],depth + 1);
        uVar9 = uVar1;
      } while ((long)uVar1 < (long)pxVar3->nodeNr);
      return;
    }
    fputs(local_178,(FILE *)output);
    pcVar8 = "NodeSet is NULL !\n";
    sVar7 = 0x12;
    break;
  case XPATH_BOOLEAN:
    fwrite("Object is a Boolean : ",0x16,1,(FILE *)output);
    if (cur->boolval == 0) {
      pcVar8 = "false\n";
      sVar7 = 6;
    }
    else {
      pcVar8 = "true\n";
      sVar7 = 5;
    }
    goto LAB_001db428;
  case XPATH_NUMBER:
    dVar2 = cur->floatval;
    iVar6 = ((0.0 < dVar2) - 1) + (uint)(0.0 < dVar2);
    if (ABS(dVar2) != INFINITY) {
      iVar6 = 0;
    }
    if (iVar6 == -1) {
      pcVar8 = "Object is a number : -Infinity\n";
      sVar7 = 0x1f;
      goto LAB_001db428;
    }
    if (iVar6 == 1) {
      pcVar8 = "Object is a number : Infinity\n";
      sVar7 = 0x1e;
      goto LAB_001db428;
    }
    if (NAN(dVar2)) {
      pcVar8 = "Object is a number : NaN\n";
      sVar7 = 0x19;
      goto LAB_001db428;
    }
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      fprintf((FILE *)output,"Object is a number : %0g\n");
      return;
    }
    pcVar8 = "Object is a number : 0\n";
    goto LAB_001db423;
  case XPATH_STRING:
    fwrite("Object is a string : ",0x15,1,(FILE *)output);
    xmlDebugDumpString(output,cur->stringval);
    goto LAB_001db7a5;
  case XPATH_POINT:
    fprintf((FILE *)output,"Object is a point : index %d in node",(ulong)(uint)cur->index);
    cur_00 = (xmlNodePtr)cur->user;
    goto LAB_001db79a;
  case XPATH_RANGE:
    if ((cur->user2 == (void *)0x0) || ((cur->user2 == cur->user && (cur->index == cur->index2)))) {
      fwrite("Object is a collapsed range :\n",0x1e,1,(FILE *)output);
      fputs(local_108,(FILE *)output);
      if (-1 < cur->index) {
        fprintf((FILE *)output,"index %d in ");
      }
      fwrite("node\n",5,1,(FILE *)output);
      xmlXPathDebugDumpNode(output,(xmlNodePtr)cur->user,depth + 1);
      return;
    }
    fwrite("Object is a range :\n",0x14,1,(FILE *)output);
    fputs(local_108,(FILE *)output);
    fwrite("From ",5,1,(FILE *)output);
    if (-1 < cur->index) {
      fprintf((FILE *)output,"index %d in ");
    }
    fwrite("node\n",5,1,(FILE *)output);
    xmlXPathDebugDumpNode(output,(xmlNodePtr)cur->user,depth + 1);
    fputs(local_108,(FILE *)output);
    fwrite("To ",3,1,(FILE *)output);
    if (-1 < cur->index2) {
      fprintf((FILE *)output,"index %d in ");
    }
    fwrite("node\n",5,1,(FILE *)output);
    cur_00 = (xmlNodePtr)cur->user2;
LAB_001db79a:
    xmlXPathDebugDumpNode(output,cur_00,depth + 1);
LAB_001db7a5:
    fputc(10,(FILE *)output);
    return;
  case XPATH_LOCATIONSET:
    fwrite("Object is a Location Set:\n",0x1a,1,(FILE *)output);
    piVar4 = (int *)cur->user;
    if (depth < 1) {
      uVar9 = 0;
    }
    else {
      uVar10 = 0x18;
      if (depth - 1U < 0x18) {
        uVar10 = depth - 1U;
      }
      uVar9 = (ulong)(uVar10 * 2 + 2);
      memset(local_178,0x20,uVar9);
    }
    (local_178 + uVar9)[0] = '\0';
    (local_178 + uVar9)[1] = '\0';
    if (piVar4 != (int *)0x0) {
      if (*piVar4 < 1) {
        return;
      }
      uVar9 = 0;
      do {
        fputs(local_178,(FILE *)output);
        uVar1 = uVar9 + 1;
        fprintf((FILE *)output,"%d : ",uVar1 & 0xffffffff);
        xmlXPathDebugDumpObject
                  (output,*(xmlXPathObjectPtr *)(*(long *)(piVar4 + 2) + uVar9 * 8),depth + 1);
        uVar9 = uVar1;
      } while ((long)uVar1 < (long)*piVar4);
      return;
    }
    fputs(local_178,(FILE *)output);
    pcVar8 = "LocationSet is NULL !\n";
    sVar7 = 0x16;
    break;
  case XPATH_USERS:
    pcVar8 = "Object is user defined\n";
LAB_001db423:
    sVar7 = 0x17;
LAB_001db428:
    fwrite(pcVar8,sVar7,1,(FILE *)output);
    return;
  case XPATH_XSLT_TREE:
    fwrite("Object is an XSLT value tree :\n",0x1f,1,(FILE *)output);
    pxVar3 = cur->nodesetval;
    if (depth < 1) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0x18;
      if (depth - 1U < 0x18) {
        uVar10 = depth - 1U;
      }
      memset(local_98,0x20,(ulong)(uVar10 * 2 + 2));
      uVar10 = uVar10 + 1;
    }
    local_98[(ulong)(uVar10 & 0x7fffffff) * 2 + 1] = '\0';
    local_98[(ulong)uVar10 * 2] = '\0';
    if (((pxVar3 == (xmlNodeSetPtr)0x0) || (pxVar3->nodeNr == 0)) ||
       (*pxVar3->nodeTab == (xmlNodePtr)0x0)) {
      fputs(local_98,(FILE *)output);
      pcVar8 = "Value Tree is NULL !\n";
      sVar7 = 0x15;
    }
    else {
      fputs(local_98,(FILE *)output);
      uVar9 = 0;
      fprintf((FILE *)output,"%d",(ulong)(uVar10 + 1));
      node = (*pxVar3->nodeTab)->children;
      if (-1 < depth) {
        iVar6 = 0x18;
        if ((uint)depth < 0x18) {
          iVar6 = depth;
        }
        uVar9 = (ulong)(iVar6 * 2 + 2);
        memset(local_178,0x20,uVar9);
      }
      (local_178 + uVar9)[0] = '\0';
      (local_178 + uVar9)[1] = '\0';
      if (node != (_xmlNode *)0x0) {
        do {
          p_Var5 = node->next;
          xmlDebugDumpOneNode(output,node,depth + 1);
          node = p_Var5;
        } while (p_Var5 != (_xmlNode *)0x0);
        return;
      }
      fputs(local_178,(FILE *)output);
      pcVar8 = "Node is NULL !\n";
      sVar7 = 0xf;
    }
    break;
  default:
    goto switchD_001db40c_default;
  }
  fwrite(pcVar8,sVar7,1,(FILE *)output);
switchD_001db40c_default:
  return;
}

Assistant:

void
xmlXPathDebugDumpObject(FILE *output, xmlXPathObjectPtr cur, int depth) {
    int i;
    char shift[100];

    if (output == NULL) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;


    fprintf(output, "%s", shift);

    if (cur == NULL) {
        fprintf(output, "Object is empty (NULL)\n");
	return;
    }
    switch(cur->type) {
        case XPATH_UNDEFINED:
	    fprintf(output, "Object is uninitialized\n");
	    break;
        case XPATH_NODESET:
	    fprintf(output, "Object is a Node Set :\n");
	    xmlXPathDebugDumpNodeSet(output, cur->nodesetval, depth);
	    break;
	case XPATH_XSLT_TREE:
	    fprintf(output, "Object is an XSLT value tree :\n");
	    xmlXPathDebugDumpValueTree(output, cur->nodesetval, depth);
	    break;
        case XPATH_BOOLEAN:
	    fprintf(output, "Object is a Boolean : ");
	    if (cur->boolval) fprintf(output, "true\n");
	    else fprintf(output, "false\n");
	    break;
        case XPATH_NUMBER:
	    switch (xmlXPathIsInf(cur->floatval)) {
	    case 1:
		fprintf(output, "Object is a number : Infinity\n");
		break;
	    case -1:
		fprintf(output, "Object is a number : -Infinity\n");
		break;
	    default:
		if (xmlXPathIsNaN(cur->floatval)) {
		    fprintf(output, "Object is a number : NaN\n");
		} else if (cur->floatval == 0) {
                    /* Omit sign for negative zero. */
		    fprintf(output, "Object is a number : 0\n");
		} else {
		    fprintf(output, "Object is a number : %0g\n", cur->floatval);
		}
	    }
	    break;
        case XPATH_STRING:
	    fprintf(output, "Object is a string : ");
	    xmlDebugDumpString(output, cur->stringval);
	    fprintf(output, "\n");
	    break;
	case XPATH_POINT:
	    fprintf(output, "Object is a point : index %d in node", cur->index);
	    xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user, depth + 1);
	    fprintf(output, "\n");
	    break;
	case XPATH_RANGE:
	    if ((cur->user2 == NULL) ||
		((cur->user2 == cur->user) && (cur->index == cur->index2))) {
		fprintf(output, "Object is a collapsed range :\n");
		fprintf(output, "%s", shift);
		if (cur->index >= 0)
		    fprintf(output, "index %d in ", cur->index);
		fprintf(output, "node\n");
		xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user,
			              depth + 1);
	    } else  {
		fprintf(output, "Object is a range :\n");
		fprintf(output, "%s", shift);
		fprintf(output, "From ");
		if (cur->index >= 0)
		    fprintf(output, "index %d in ", cur->index);
		fprintf(output, "node\n");
		xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user,
			              depth + 1);
		fprintf(output, "%s", shift);
		fprintf(output, "To ");
		if (cur->index2 >= 0)
		    fprintf(output, "index %d in ", cur->index2);
		fprintf(output, "node\n");
		xmlXPathDebugDumpNode(output, (xmlNodePtr) cur->user2,
			              depth + 1);
		fprintf(output, "\n");
	    }
	    break;
	case XPATH_LOCATIONSET:
#if defined(LIBXML_XPTR_ENABLED)
	    fprintf(output, "Object is a Location Set:\n");
	    xmlXPathDebugDumpLocationSet(output,
		    (xmlLocationSetPtr) cur->user, depth);
#endif
	    break;
	case XPATH_USERS:
	    fprintf(output, "Object is user defined\n");
	    break;
    }
}